

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::PartialBlockManager::Merge(PartialBlockManager *this,PartialBlockManager *other)

{
  BlockManager *pBVar1;
  uint segment_size;
  idx_t iVar2;
  idx_t iVar3;
  _Base_ptr p_Var4;
  pointer pPVar5;
  type pPVar6;
  _Base_ptr p_Var7;
  InternalException *pIVar8;
  _Rb_tree_header *p_Var9;
  ulong uVar10;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Var11;
  _Base_ptr p_Var12;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  uint32_t local_98;
  undefined4 uStack_94;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Stack_90;
  _Rb_tree_header *local_88;
  PartialBlockManager *local_80;
  _Base_ptr local_78;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
  *local_70;
  undefined1 local_68 [16];
  size_type local_58;
  undefined8 uStack_50;
  uint32_t local_48;
  undefined4 uStack_44;
  _Head_base<0UL,_duckdb::PartialBlock_*,_false> _Stack_40;
  
  if (other == this) {
    pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = &local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Cannot merge into itself","");
    InternalException::InternalException(pIVar8,(string *)local_b8);
    __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var7 = (other->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(other->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = other;
  if (p_Var7 != p_Var12) {
    local_88 = &(this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header;
    local_70 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
                *)&this->partially_filled_blocks;
    local_78 = p_Var12;
    do {
      if (p_Var7[1]._M_parent == (_Base_ptr)0x0) {
        pIVar8 = (InternalException *)__cxa_allocate_exception(0x10);
        local_b8._0_8_ = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Empty partially filled block found","");
        InternalException::InternalException(pIVar8,(string *)local_b8);
        __cxa_throw(pIVar8,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pBVar1 = this->block_manager;
      iVar2 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
      iVar3 = optional_idx::GetIndex(&pBVar1->block_header_size);
      segment_size = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                               (iVar2 - (iVar3 + *(long *)(p_Var7 + 1)));
      if ((this->max_partial_block_size < segment_size) ||
         (p_Var4 = (this->partially_filled_blocks)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent, p_Var4 == (_Base_ptr)0x0)) {
LAB_017cc689:
        local_b8._0_8_ = *(undefined8 *)(p_Var7 + 1);
        local_b8._8_8_ = p_Var7[1]._M_parent;
        p_Var7[1]._M_parent = (_Base_ptr)0x0;
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::PartialBlock,std::default_delete<duckdb::PartialBlock>,true>>>
                  (local_70,(pair<unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>
                             *)local_b8);
        _Var11._M_head_impl = (PartialBlock *)local_b8._8_8_;
      }
      else {
        uVar10 = (ulong)segment_size;
        p_Var9 = local_88;
        do {
          if (*(ulong *)(p_Var4 + 1) >= uVar10) {
            p_Var9 = (_Rb_tree_header *)p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar10];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (p_Var9 == local_88) goto LAB_017cc689;
        GetBlockAllocation((PartialBlockAllocation *)local_b8,this,segment_size);
        pPVar5 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
                 operator->((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                             *)&_Stack_90);
        pPVar6 = unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>::
                 operator*((unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>
                            *)&p_Var7[1]._M_parent);
        (*pPVar5->_vptr_PartialBlock[3])(pPVar5,pPVar6,(ulong)(uint)local_a8._12_4_,uVar10);
        local_a8._12_4_ = local_a8._12_4_ + segment_size;
        local_68._0_8_ = local_b8._0_8_;
        local_68._8_8_ = local_b8._8_8_;
        local_48 = local_98;
        uStack_44 = uStack_94;
        _Stack_40._M_head_impl = _Stack_90._M_head_impl;
        uStack_50._4_4_ = local_a8._12_4_;
        uStack_50._0_4_ = local_a8._8_4_;
        local_58 = local_a8._M_allocated_capacity;
        _Stack_90._M_head_impl = (PartialBlock *)0x0;
        RegisterPartialBlock(this,(PartialBlockAllocation *)local_68);
        p_Var12 = local_78;
        if ((tuple<duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
            _Stack_40._M_head_impl != (_Head_base<0UL,_duckdb::PartialBlock_*,_false>)0x0) {
          (**(code **)(*(long *)_Stack_40._M_head_impl + 8))();
        }
        _Stack_40._M_head_impl = (PartialBlock *)0x0;
        _Var11._M_head_impl = _Stack_90._M_head_impl;
      }
      if ((_Tuple_impl<0UL,_duckdb::PartialBlock_*,_std::default_delete<duckdb::PartialBlock>_>)
          _Var11._M_head_impl != (PartialBlock *)0x0) {
        (**(code **)(*(long *)_Var11._M_head_impl + 8))();
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while (p_Var7 != p_Var12);
  }
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::PartialBlock,_std::default_delete<duckdb::PartialBlock>,_true>_>_>_>
  ::clear(&(local_80->partially_filled_blocks)._M_t);
  return;
}

Assistant:

void PartialBlockManager::Merge(PartialBlockManager &other) {
	if (&other == this) {
		throw InternalException("Cannot merge into itself");
	}
	// for each partially filled block in the other manager, check if we can merge it into an existing block in this
	// manager
	for (auto &e : other.partially_filled_blocks) {
		if (!e.second) {
			throw InternalException("Empty partially filled block found");
		}
		auto used_space = NumericCast<uint32_t>(block_manager.GetBlockSize() - e.first);
		if (HasBlockAllocation(used_space)) {
			// we can merge this block into an existing block - merge them
			// merge blocks
			auto allocation = GetBlockAllocation(used_space);
			allocation.partial_block->Merge(*e.second, allocation.state.offset, used_space);

			// re-register the partial block
			allocation.state.offset += used_space;
			RegisterPartialBlock(std::move(allocation));
		} else {
			// we cannot merge this block - append it directly to the current block manager
			partially_filled_blocks.insert(make_pair(e.first, std::move(e.second)));
		}
	}
	other.partially_filled_blocks.clear();
}